

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

void __thiscall QPDF::reconstruct_xref(QPDF *this,QPDFExc *e,bool found_startxref)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  _Base_ptr p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  key_type *__k;
  key_type *pkVar4;
  undefined4 uVar5;
  undefined1 auVar6 [8];
  _Alloc_hider _Var7;
  void *pvVar8;
  key_type *pkVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  _Base_ptr p_Var14;
  long lVar15;
  long lVar16;
  undefined8 uVar17;
  long *plVar18;
  longlong xref_offset;
  qpdf_offset_t qVar19;
  QPDFExc *pQVar20;
  QPDFObject *__tmp;
  ulong uVar21;
  size_type *psVar22;
  uint uVar23;
  char *__end;
  uint __len;
  _Base_ptr p_Var24;
  void *pvVar25;
  QPDFObjGen *iter;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *this_00;
  longlong *plVar26;
  bool bVar27;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  pVar28;
  QPDFObjectHandle t;
  int obj;
  Token t2;
  Token t1;
  QPDFObjectHandle root;
  vector<long_long,_std::allocator<long_long>_> trailers;
  vector<long_long,_std::allocator<long_long>_> startxrefs;
  anon_class_16_2_2ef5c38d check_warnings;
  int gen;
  vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
  found_objects;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> to_delete;
  qpdf_offset_t token_start;
  long local_368;
  undefined1 local_360 [36];
  uint local_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  _Rb_tree_node_base local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  _Alloc_hider local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  undefined1 local_2d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  _Alloc_hider local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined1 local_268 [8];
  _Alloc_hider _Stack_260;
  undefined1 local_258 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [2];
  string local_1e8;
  QPDFObjectHandle local_1c8;
  undefined1 local_1b8 [48];
  vector<long_long,_std::allocator<long_long>_> local_188;
  anon_class_16_2_2ef5c38d local_170;
  int local_15c;
  void *local_158;
  void *pvStack_150;
  long local_148;
  key_type *local_138;
  key_type *pkStack_130;
  long local_128;
  long local_118;
  QPDFObjectHandle local_110;
  long *local_100;
  size_t local_f8;
  long local_f0 [2];
  long *local_e0;
  size_t local_d8;
  long local_d0 [2];
  long *local_c0;
  size_t local_b8;
  long local_b0 [2];
  long local_a0;
  Token local_98;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->reconstructed_xref == true) {
    pQVar20 = (QPDFExc *)__cxa_allocate_exception(0x80);
    QPDFExc::QPDFExc(pQVar20,e);
    __cxa_throw(pQVar20,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  local_170.max_warnings =
       ((long)*(pointer *)((long)&(_Var1._M_head_impl)->warnings + 8) -
        *(long *)&((_Var1._M_head_impl)->warnings).
                  super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_> >> 7) + 1000;
  (_Var1._M_head_impl)->reconstructed_xref = true;
  (_Var1._M_head_impl)->fixed_dangling_refs = false;
  local_2d0._0_8_ = local_2d0 + 0x10;
  local_170.this = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
  local_338._0_8_ = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"file is damaged","");
  damagedPDF((QPDFExc *)local_268,this,(string *)local_2d0,-1,(string *)local_338);
  warn(this,(QPDFExc *)local_268);
  QPDFExc::~QPDFExc((QPDFExc *)local_268);
  if ((undefined1 *)local_338._0_8_ != local_328) {
    operator_delete((void *)local_338._0_8_,(ulong)((long)local_328 + 1));
  }
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  warn(this,e);
  local_2d0._0_8_ = local_2d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
  local_338._0_8_ = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"Attempting to reconstruct cross-reference table","");
  damagedPDF((QPDFExc *)local_268,this,(string *)local_2d0,-1,(string *)local_338);
  warn(this,(QPDFExc *)local_268);
  QPDFExc::~QPDFExc((QPDFExc *)local_268);
  if ((_Base_ptr)local_338._0_8_ != (_Base_ptr)local_328) {
    operator_delete((void *)local_338._0_8_,(ulong)((long)local_328 + 1));
  }
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  local_138 = (key_type *)0x0;
  pkStack_130 = (key_type *)0x0;
  local_128 = 0;
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  p_Var14 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->xref_table + 0x18);
  p_Var24 = (_Base_ptr)((long)&(_Var1._M_head_impl)->xref_table + 8);
  __k = local_138;
  pkVar4 = pkStack_130;
  if (p_Var14 != p_Var24) {
    do {
      iVar11 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var14[1]._M_parent);
      if (iVar11 == 1) {
        std::vector<QPDFObjGen,std::allocator<QPDFObjGen>>::emplace_back<QPDFObjGen_const&>
                  ((vector<QPDFObjGen,std::allocator<QPDFObjGen>> *)&local_138,
                   (QPDFObjGen *)(p_Var14 + 1));
      }
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      __k = local_138;
      pkVar4 = pkStack_130;
    } while (p_Var14 != p_Var24);
  }
  for (; pkVar9 = pkStack_130, __k != pkStack_130; __k = __k + 1) {
    this_00 = &((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table;
    pkStack_130 = pkVar4;
    pVar28 = std::
             _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
             ::equal_range(&this_00->_M_t,__k);
    std::
    _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar28.first._M_node,(_Base_ptr)pVar28.second._M_node);
    pkVar4 = pkStack_130;
    pkStack_130 = pkVar9;
  }
  local_158 = (void *)0x0;
  pvStack_150 = (void *)0x0;
  local_148 = 0;
  local_1b8._32_8_ = (longlong *)0x0;
  local_1b8._16_8_ = (longlong *)0x0;
  local_1b8._24_8_ = (longlong *)0x0;
  local_188.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  plVar18 = *(long **)&(((this->m)._M_t.
                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  pkStack_130 = pkVar4;
  (**(code **)(*plVar18 + 0x28))(plVar18,0,2);
  lVar15 = (**(code **)(**(long **)&(((this->m)._M_t.
                                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                      .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                    file).
                                    super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                       0x20))();
  plVar18 = *(long **)&(((this->m)._M_t.
                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar18 + 0x28))(plVar18,0,0);
  local_118 = lVar15;
  while (lVar16 = (**(code **)(**(long **)&(((this->m)._M_t.
                                             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                             .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                            _M_head_impl)->file).
                                           super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                              + 0x20))(), lVar16 < lVar15) {
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    ::qpdf::Tokenizer::readToken
              ((Token *)local_2d0,&(_Var1._M_head_impl)->tokenizer,
               ((_Var1._M_head_impl)->file).
               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &(_Var1._M_head_impl)->last_object_description,true,10);
    lVar16 = (**(code **)(**(long **)&(((this->m)._M_t.
                                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                      ->file).
                                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                         0x20))();
    uVar17 = local_2d0._16_8_;
    if ((long)local_2d0._16_8_ < 0) {
      QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(local_2d0._16_8_);
    }
    local_a0 = lVar16 - uVar17;
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    if (local_2d0._0_4_ == tt_integer) {
      uVar17 = (**(code **)(**(long **)&((_Var1._M_head_impl)->file).
                                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                           + 0x20))();
      _Var1._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      ::qpdf::Tokenizer::readToken
                ((Token *)local_338,&(_Var1._M_head_impl)->tokenizer,
                 ((_Var1._M_head_impl)->file).
                 super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &(_Var1._M_head_impl)->last_object_description,true,10);
      uVar5 = local_338._0_4_;
      if (local_338._0_4_ == tt_integer) {
        _Var1._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        ::qpdf::Tokenizer::readToken
                  (&local_98,&(_Var1._M_head_impl)->tokenizer,
                   ((_Var1._M_head_impl)->file).
                   super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   &(_Var1._M_head_impl)->last_object_description,true,10);
        local_c0 = local_b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"obj","");
        if ((local_98.type != tt_word) || (local_98.value._M_string_length != local_b8))
        goto LAB_00226ebd;
        if (local_98.value._M_string_length == 0) {
          bVar27 = true;
        }
        else {
          iVar11 = bcmp(local_98.value._M_dataplus._M_p,local_c0,local_98.value._M_string_length);
          bVar27 = iVar11 == 0;
        }
      }
      else {
LAB_00226ebd:
        bVar27 = false;
      }
      if (uVar5 == tt_integer) {
        if (local_c0 != local_b0) {
          operator_delete(local_c0,local_b0[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.error_message._M_dataplus._M_p != &local_98.error_message.field_2) {
          operator_delete(local_98.error_message._M_dataplus._M_p,
                          local_98.error_message.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.raw_value._M_dataplus._M_p != &local_98.raw_value.field_2) {
          operator_delete(local_98.raw_value._M_dataplus._M_p,
                          local_98.raw_value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.value._M_dataplus._M_p != &local_98.value.field_2) {
          operator_delete(local_98.value._M_dataplus._M_p,
                          local_98.value.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar27) {
        local_33c = QUtil::string_to_int((char *)local_2d0._8_8_);
        local_15c = QUtil::string_to_int((char *)local_338._8_8_);
        if (((this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table_max_id <
            (int)local_33c) {
          local_360._0_8_ = local_360 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"");
          uVar13 = -local_33c;
          if (0 < (int)local_33c) {
            uVar13 = local_33c;
          }
          __len = 1;
          if (9 < uVar13) {
            uVar21 = (ulong)uVar13;
            uVar23 = 4;
            do {
              __len = uVar23;
              uVar12 = (uint)uVar21;
              if (uVar12 < 100) {
                __len = __len - 2;
                goto LAB_0022718e;
              }
              if (uVar12 < 1000) {
                __len = __len - 1;
                goto LAB_0022718e;
              }
              if (uVar12 < 10000) goto LAB_0022718e;
              uVar21 = uVar21 / 10000;
              uVar23 = __len + 4;
            } while (99999 < uVar12);
            __len = __len + 1;
          }
LAB_0022718e:
          uVar23 = local_33c >> 0x1f;
          local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_1b8;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_1c8,(char)__len - (char)((int)local_33c >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)&((local_1c8.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->value).
                                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             + (ulong)uVar23),__len,uVar13);
          plVar18 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x282526);
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          psVar22 = (size_type *)(plVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar18 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar22) {
            local_1e8.field_2._M_allocated_capacity = *psVar22;
            local_1e8.field_2._8_8_ = plVar18[3];
          }
          else {
            local_1e8.field_2._M_allocated_capacity = *psVar22;
            local_1e8._M_dataplus._M_p = (pointer)*plVar18;
          }
          local_1e8._M_string_length = plVar18[1];
          *plVar18 = (long)psVar22;
          plVar18[1] = 0;
          *(undefined1 *)(plVar18 + 2) = 0;
          damagedPDF((QPDFExc *)local_268,this,(string *)local_360,-1,&local_1e8);
          warn(this,(QPDFExc *)local_268);
          QPDFExc::~QPDFExc((QPDFExc *)local_268);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          if (local_1c8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)local_1b8) {
            operator_delete(local_1c8.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            local_1b8._0_8_ + 1);
          }
          if ((_Base_ptr)local_360._0_8_ != (_Base_ptr)(local_360 + 0x10)) {
            operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
          }
        }
        else {
          std::vector<std::tuple<int,int,long_long>,std::allocator<std::tuple<int,int,long_long>>>::
          emplace_back<int&,int&,long_long&>
                    ((vector<std::tuple<int,int,long_long>,std::allocator<std::tuple<int,int,long_long>>>
                      *)&local_158,(int *)&local_33c,&local_15c,&local_a0);
        }
      }
      plVar18 = *(long **)&(((this->m)._M_t.
                             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                             .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                           super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar18 + 0x28))(plVar18,uVar17,0);
      lVar15 = local_118;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_p != &local_2e0) {
        operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_left != &local_300) {
        operator_delete(local_320._M_left,local_300._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_node_base *)local_338._8_8_ != &local_320) {
        operator_delete((void *)local_338._8_8_,local_320._0_8_ + 1);
      }
    }
    else {
      lVar16 = *(long *)&((_Var1._M_head_impl)->trailer).super_BaseHandle;
      if (lVar16 == 0) {
        local_e0 = local_d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"trailer","");
        if ((local_2d0._0_4_ != tt_word) || (local_2d0._16_8_ != local_d8)) goto LAB_00226e46;
        if (local_2d0._16_8_ == 0) {
          bVar27 = true;
        }
        else {
          iVar11 = bcmp((void *)local_2d0._8_8_,local_e0,local_2d0._16_8_);
          bVar27 = iVar11 == 0;
        }
      }
      else {
LAB_00226e46:
        bVar27 = false;
      }
      if ((lVar16 == 0) && (local_e0 != local_d0)) {
        operator_delete(local_e0,local_d0[0] + 1);
      }
      if (bVar27) {
        local_268 = (undefined1  [8])
                    (**(code **)(**(long **)&(((this->m)._M_t.
                                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                               .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                              _M_head_impl)->file).
                                             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                                + 0x20))();
        if (local_1b8._24_8_ == local_1b8._32_8_) {
          std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                    ((vector<long_long,_std::allocator<long_long>_> *)(local_1b8 + 0x10),
                     (iterator)local_1b8._24_8_,(longlong *)local_268);
        }
        else {
          *(undefined1 (*) [8])local_1b8._24_8_ = local_268;
          local_1b8._24_8_ = local_1b8._24_8_ + 8;
        }
      }
      else {
        if (found_startxref) {
LAB_002270a5:
          bVar27 = false;
        }
        else {
          local_100 = local_f0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"startxref","");
          if ((local_2d0._0_4_ != tt_word) || (local_2d0._16_8_ != local_f8)) goto LAB_002270a5;
          if (local_2d0._16_8_ == 0) {
            bVar27 = true;
          }
          else {
            iVar11 = bcmp((void *)local_2d0._8_8_,local_100,local_2d0._16_8_);
            bVar27 = iVar11 == 0;
          }
        }
        if ((!found_startxref) && (local_100 != local_f0)) {
          operator_delete(local_100,local_f0[0] + 1);
        }
        if (bVar27) {
          local_268 = (undefined1  [8])
                      (**(code **)(**(long **)&(((this->m)._M_t.
                                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                                 .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                                _M_head_impl)->file).
                                               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                                  + 0x20))();
          if (local_188.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_188.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                      (&local_188,
                       (iterator)
                       local_188.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(longlong *)local_268);
          }
          else {
            *local_188.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (longlong)local_268;
            local_188.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_188.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
    }
    reconstruct_xref::anon_class_16_2_2ef5c38d::operator()(&local_170);
    (**(code **)(**(long **)&(((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> + 0x10))();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_p != &local_278) {
      operator_delete(local_288._M_p,local_278._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_p != &local_298) {
      operator_delete(local_2a8._M_p,local_298._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._8_8_ != &local_2b8) {
      operator_delete((void *)local_2d0._8_8_,local_2b8._0_8_ + 1);
    }
  }
  if ((((!found_startxref) &&
       (local_188.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_188.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish)) && (local_158 != pvStack_150)) &&
     (lVar15 = *(long *)((long)&(((element_type *)
                                 ((long)local_188.
                                        super__Vector_base<long_long,_std::allocator<long_long>_>.
                                        _M_impl.super__Vector_impl_data._M_finish + -0x40))->
                                super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                                ).
                                super__Move_assign_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                                .
                                super__Copy_assign_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                                .
                                super__Move_ctor_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                                .
                                super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                                .
                                super__Variant_storage_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                        + 0x38), *(long *)((long)pvStack_150 + -0x10) < lVar15)) {
    plVar18 = *(long **)&(((this->m)._M_t.
                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                           .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                         super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar18 + 0x28))(plVar18,lVar15,0);
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    ::qpdf::Tokenizer::readToken
              ((Token *)local_268,&(_Var1._M_head_impl)->tokenizer,
               ((_Var1._M_head_impl)->file).
               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &(_Var1._M_head_impl)->last_object_description,true,0);
    xref_offset = QUtil::string_to_ll(_Stack_260._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_allocated_capacity != local_210) {
      operator_delete((void *)local_220._M_allocated_capacity,local_210[0]._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_allocated_capacity != &local_230) {
      operator_delete((void *)local_240._M_allocated_capacity,
                      (ulong)(local_230._M_allocated_capacity + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_260._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_258 + 8)) {
      operator_delete(_Stack_260._M_p,(ulong)(local_258._8_8_ + 1));
    }
    if (xref_offset != 0) {
      read_xref(this,xref_offset);
      getRoot((QPDF *)local_338);
      local_268 = (undefined1  [8])local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"/Pages","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_2d0,(string *)local_338);
      bVar27 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_2d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_);
      }
      if (local_268 != (undefined1  [8])local_258) {
        operator_delete((void *)local_268,local_258._0_8_ + 1);
      }
      if ((_Rb_tree_node_base *)local_338._8_8_ != (_Rb_tree_node_base *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_);
      }
      if (bVar27) {
        local_2d0._0_8_ = local_2d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
        local_338._0_8_ = local_328;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"startxref was more than 1024 bytes before end of file","");
        damagedPDF((QPDFExc *)local_268,this,(string *)local_2d0,-1,(string *)local_338);
        warn(this,(QPDFExc *)local_268);
        QPDFExc::~QPDFExc((QPDFExc *)local_268);
        if ((_Base_ptr)local_338._0_8_ != (_Base_ptr)local_328) {
          operator_delete((void *)local_338._0_8_,(ulong)((long)local_328 + 1));
        }
        if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
          operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
        }
        initializeEncryption(this);
        _Var1._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        (_Var1._M_head_impl)->parsed = true;
        (_Var1._M_head_impl)->reconstructed_xref = false;
        goto LAB_0022817e;
      }
    }
  }
  pvVar8 = local_158;
  for (pvVar25 = pvStack_150; pvVar25 != pvVar8; pvVar25 = (void *)((long)pvVar25 + -0x10)) {
    insertXrefEntry(this,*(int *)((long)pvVar25 + -4),1,*(qpdf_offset_t *)((long)pvVar25 + -0x10),
                    *(int *)((long)pvVar25 + -8));
    reconstruct_xref::anon_class_16_2_2ef5c38d::operator()(&local_170);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->deleted_objects)._M_t);
  if (local_1b8._24_8_ != local_1b8._16_8_) {
    plVar26 = (longlong *)local_1b8._24_8_;
    do {
      plVar18 = *(long **)&(((this->m)._M_t.
                             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                             .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                           super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar18 + 0x28))(plVar18,plVar26[-1],0);
      readTrailer((QPDF *)local_360);
      bVar27 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_360);
      plVar26 = plVar26 + -1;
      if (bVar27) {
        local_268 = (undefined1  [8])local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"/Root","");
        bVar27 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_360,(string *)local_268);
        if (local_268 != (undefined1  [8])local_258) {
          operator_delete((void *)local_268,local_258._0_8_ + 1);
        }
        if (bVar27) {
          _Var1._M_head_impl =
               (this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
          *(undefined8 *)&((_Var1._M_head_impl)->trailer).super_BaseHandle = local_360._0_8_;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var1._M_head_impl)->trailer + 8),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_360 + 8));
          if ((_Base_ptr)local_360._8_8_ != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._8_8_);
          }
          break;
        }
        local_2d0._0_8_ = local_2d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"trailer","");
        qVar19 = *plVar26;
        local_338._0_8_ = local_328;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"recovered trailer has no /Root entry","");
        damagedPDF((QPDFExc *)local_268,this,(string *)local_2d0,qVar19,(string *)local_338);
        warn(this,(QPDFExc *)local_268);
        QPDFExc::~QPDFExc((QPDFExc *)local_268);
        if ((_Base_ptr)local_338._0_8_ != (_Base_ptr)local_328) {
          operator_delete((void *)local_338._0_8_,(ulong)((long)local_328 + 1));
        }
        if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
          operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
        }
      }
      reconstruct_xref::anon_class_16_2_2ef5c38d::operator()(&local_170);
      if ((_Base_ptr)local_360._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._8_8_);
      }
    } while (plVar26 != (longlong *)local_1b8._16_8_);
  }
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(long *)&((_Var1._M_head_impl)->trailer).super_BaseHandle == 0) {
    p_Var14 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->xref_table + 0x18);
    p_Var24 = (_Base_ptr)((long)&(_Var1._M_head_impl)->xref_table + 8);
    if (p_Var14 == p_Var24) {
      local_368 = 0;
    }
    else {
      local_368 = 0;
      do {
        local_328 = (undefined1  [8])p_Var14[1]._M_right;
        local_338._0_8_ = p_Var14[1]._M_parent;
        local_338._8_8_ = p_Var14[1]._M_left;
        iVar11 = QPDFXRefEntry::getType((QPDFXRefEntry *)local_338);
        if (iVar11 == 1) {
          getObject((QPDF *)local_360,(QPDFObjGen)this);
          local_268 = (undefined1  [8])local_258;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"/XRef","");
          local_2d0._0_8_ = local_2d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
          bVar27 = QPDFObjectHandle::isStreamOfType
                             ((QPDFObjectHandle *)local_360,(string *)local_268,(string *)local_2d0)
          ;
          if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
            operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
          }
          if (local_268 != (undefined1  [8])local_258) {
            operator_delete((void *)local_268,local_258._0_8_ + 1);
          }
          if (bVar27) {
            qVar19 = QPDFXRefEntry::getOffset((QPDFXRefEntry *)local_338);
            QPDFObjectHandle::getDict((QPDFObjectHandle *)&local_1e8);
            local_268 = (undefined1  [8])local_258;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"/Size","");
            QPDFObjectHandle::getKey((QPDFObjectHandle *)local_2d0,&local_1e8);
            uVar13 = QPDFObjectHandle::getUIntValueAsUInt((QPDFObjectHandle *)local_2d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._8_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_);
            }
            if (local_268 != (undefined1  [8])local_258) {
              operator_delete((void *)local_268,local_258._0_8_ + 1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length)
              ;
            }
            if (local_368 < qVar19 || uVar13 != 0) {
              QPDFObjectHandle::getDict(&local_110);
              _Var1._M_head_impl =
                   (this->m)._M_t.
                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
              if (*(long *)&((_Var1._M_head_impl)->trailer).super_BaseHandle == 0) {
                *(element_type **)&((_Var1._M_head_impl)->trailer).super_BaseHandle =
                     local_110.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)&(_Var1._M_head_impl)->trailer + 8),
                           &local_110.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
              }
              local_368 = qVar19;
              if (local_110.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_110.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
            }
            reconstruct_xref::anon_class_16_2_2ef5c38d::operator()(&local_170);
          }
          if ((_Base_ptr)local_360._8_8_ != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._8_8_);
          }
        }
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      } while (p_Var14 != p_Var24);
    }
    if (0 < local_368) {
      read_xref(this,local_368);
    }
  }
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(long *)&((_Var1._M_head_impl)->trailer).super_BaseHandle == 0) {
    bVar10 = true;
    bVar27 = false;
  }
  else if ((_Var1._M_head_impl)->parsed == false) {
    local_2d0._0_8_ = local_2d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"/Root","");
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)&local_1e8,(string *)&(_Var1._M_head_impl)->trailer);
    bVar10 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_1e8);
    bVar10 = !bVar10;
    bVar27 = true;
  }
  else {
    bVar27 = false;
    bVar10 = false;
  }
  if (bVar27) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length);
    }
    if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
      operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
    }
  }
  if (bVar10) {
    local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    p_Var14 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->obj_cache + 0x18);
    p_Var24 = (_Base_ptr)((long)&(_Var1._M_head_impl)->obj_cache + 8);
    if (p_Var14 != p_Var24) {
      do {
        local_360._0_8_ = p_Var14[1]._M_parent;
        local_360._8_8_ = p_Var14[1]._M_left;
        if ((_Base_ptr)local_360._8_8_ != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((_Base_ptr)local_360._8_8_)->_M_parent =
                 *(int *)&((_Base_ptr)local_360._8_8_)->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&((_Base_ptr)local_360._8_8_)->_M_parent =
                 *(int *)&((_Base_ptr)local_360._8_8_)->_M_parent + 1;
          }
        }
        local_268 = (undefined1  [8])local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"/Catalog","");
        local_338._0_8_ = local_328;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"","");
        bVar27 = QPDFObjectHandle::isDictionaryOfType
                           ((QPDFObjectHandle *)local_360,(string *)local_268,(string *)local_338);
        if ((_Base_ptr)local_338._0_8_ != (_Base_ptr)local_328) {
          operator_delete((void *)local_338._0_8_,(ulong)((long)local_328 + 1));
        }
        if (local_268 != (undefined1  [8])local_258) {
          operator_delete((void *)local_268,local_258._0_8_ + 1);
        }
        if ((_Base_ptr)local_360._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._8_8_);
        }
        _Var3._M_pi = local_1c8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (bVar27) {
          local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)p_Var14[1]._M_parent;
          p_Var2 = p_Var14[1]._M_left;
          if (p_Var2 != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
              UNLOCK();
            }
            else {
              *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
            }
          }
          bVar27 = (_Base_ptr)
                   local_1c8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                   (_Base_ptr)0x0;
          local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
          if (bVar27) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
          }
        }
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      } while (p_Var14 != p_Var24);
    }
    if (local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      if (*(long *)&(((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->trailer).
                    super_BaseHandle == 0) {
        local_338._0_8_ = local_328;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"");
        local_360._0_8_ = local_360 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_360,
                   "unable to find trailer dictionary while recovering damaged file","");
        damagedPDF((QPDFExc *)local_268,this,(string *)local_338,-1,(string *)local_360);
        warn(this,(QPDFExc *)local_268);
        QPDFExc::~QPDFExc((QPDFExc *)local_268);
        if ((_Base_ptr)local_360._0_8_ != (_Base_ptr)(local_360 + 0x10)) {
          operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
        }
        if ((_Base_ptr)local_338._0_8_ != (_Base_ptr)local_328) {
          operator_delete((void *)local_338._0_8_,(ulong)((long)local_328 + 1));
        }
        QPDFObjectHandle::newDictionary();
        _Var7._M_p = _Stack_260._M_p;
        auVar6 = local_268;
        _Var1._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        local_268 = (undefined1  [8])0x0;
        _Stack_260._M_p = (pointer)0x0;
        _Var3._M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&(_Var1._M_head_impl)->trailer + 8))->_M_pi;
        *(undefined1 (*) [8])&((_Var1._M_head_impl)->trailer).super_BaseHandle = auVar6;
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var1._M_head_impl)->trailer + 8))->
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var7._M_p;
        if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_260._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_260._M_p);
        }
      }
      _Var1._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_268 = (undefined1  [8])local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"/Root","");
      QPDFObjectHandle::replaceKey(&(_Var1._M_head_impl)->trailer,(string *)local_268,&local_1c8);
      if (local_268 != (undefined1  [8])local_258) {
        operator_delete((void *)local_268,local_258._0_8_ + 1);
      }
    }
    if ((_Base_ptr)
        local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(long *)&((_Var1._M_head_impl)->trailer).super_BaseHandle == 0) {
    pQVar20 = (QPDFExc *)__cxa_allocate_exception(0x80);
    local_268 = (undefined1  [8])local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"");
    local_338._0_8_ = local_328;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"unable to find trailer dictionary while recovering damaged file"
               ,"");
    damagedPDF(pQVar20,this,(string *)local_268,-1,(string *)local_338);
    __cxa_throw(pQVar20,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  if (*(size_t *)((long)&(_Var1._M_head_impl)->xref_table + 0x28) == 0) {
    pQVar20 = (QPDFExc *)__cxa_allocate_exception(0x80);
    local_268 = (undefined1  [8])local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"");
    local_338._0_8_ = local_328;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"unable to find objects while recovering damaged file","");
    damagedPDF(pQVar20,this,(string *)local_268,-1,(string *)local_338);
    __cxa_throw(pQVar20,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  reconstruct_xref::anon_class_16_2_2ef5c38d::operator()(&local_170);
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->parsed == false) {
    (_Var1._M_head_impl)->parsed = true;
    getAllPages(this);
    reconstruct_xref::anon_class_16_2_2ef5c38d::operator()(&local_170);
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    if (*(pointer *)
         &((_Var1._M_head_impl)->all_pages).
          super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> ==
        *(pointer *)((long)&(_Var1._M_head_impl)->all_pages + 8)) {
      (_Var1._M_head_impl)->parsed = false;
      pQVar20 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_268 = (undefined1  [8])local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"");
      local_338._0_8_ = local_328;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"unable to find any pages while recovering damaged file","");
      damagedPDF(pQVar20,this,(string *)local_268,-1,(string *)local_338);
      __cxa_throw(pQVar20,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
  }
LAB_0022817e:
  if ((element_type *)
      local_188.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_188.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<long_long,_std::allocator<long_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<long_long,_std::allocator<long_long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((longlong *)local_1b8._16_8_ != (longlong *)0x0) {
    operator_delete((void *)local_1b8._16_8_,local_1b8._32_8_ - local_1b8._16_8_);
  }
  if (local_158 != (void *)0x0) {
    operator_delete(local_158,local_148 - (long)local_158);
  }
  if (local_138 != (key_type *)0x0) {
    operator_delete(local_138,local_128 - (long)local_138);
  }
  return;
}

Assistant:

void
QPDF::reconstruct_xref(QPDFExc& e, bool found_startxref)
{
    if (m->reconstructed_xref) {
        // Avoid xref reconstruction infinite loops. This is getting very hard to reproduce because
        // qpdf is throwing many fewer exceptions while parsing. Most situations are warnings now.
        throw e;
    }

    // If recovery generates more than 1000 warnings, the file is so severely damaged that there
    // probably is no point trying to continue.
    const auto max_warnings = m->warnings.size() + 1000U;
    auto check_warnings = [this, max_warnings]() {
        if (m->warnings.size() > max_warnings) {
            throw damagedPDF("", -1, "too many errors while reconstructing cross-reference table");
        }
    };

    m->reconstructed_xref = true;
    // We may find more objects, which may contain dangling references.
    m->fixed_dangling_refs = false;

    warn(damagedPDF("", -1, "file is damaged"));
    warn(e);
    warn(damagedPDF("", -1, "Attempting to reconstruct cross-reference table"));

    // Delete all references to type 1 (uncompressed) objects
    std::vector<QPDFObjGen> to_delete;
    for (auto const& iter: m->xref_table) {
        if (iter.second.getType() == 1) {
            to_delete.emplace_back(iter.first);
        }
    }
    for (auto const& iter: to_delete) {
        m->xref_table.erase(iter);
    }

    std::vector<std::tuple<int, int, qpdf_offset_t>> found_objects;
    std::vector<qpdf_offset_t> trailers;
    std::vector<qpdf_offset_t> startxrefs;

    m->file->seek(0, SEEK_END);
    qpdf_offset_t eof = m->file->tell();
    m->file->seek(0, SEEK_SET);
    // Don't allow very long tokens here during recovery. All the interesting tokens are covered.
    static size_t const MAX_LEN = 10;
    while (m->file->tell() < eof) {
        QPDFTokenizer::Token t1 = readToken(*m->file, MAX_LEN);
        qpdf_offset_t token_start = m->file->tell() - toO(t1.getValue().length());
        if (t1.isInteger()) {
            auto pos = m->file->tell();
            auto t2 = readToken(*m->file, MAX_LEN);
            if (t2.isInteger() && readToken(*m->file, MAX_LEN).isWord("obj")) {
                int obj = QUtil::string_to_int(t1.getValue().c_str());
                int gen = QUtil::string_to_int(t2.getValue().c_str());
                if (obj <= m->xref_table_max_id) {
                    found_objects.emplace_back(obj, gen, token_start);
                } else {
                    warn(damagedPDF(
                        "", -1, "ignoring object with impossibly large id " + std::to_string(obj)));
                }
            }
            m->file->seek(pos, SEEK_SET);
        } else if (!m->trailer && t1.isWord("trailer")) {
            trailers.emplace_back(m->file->tell());
        } else if (!found_startxref && t1.isWord("startxref")) {
            startxrefs.emplace_back(m->file->tell());
        }
        check_warnings();
        m->file->findAndSkipNextEOL();
    }

    if (!found_startxref && !startxrefs.empty() && !found_objects.empty() &&
        startxrefs.back() > std::get<2>(found_objects.back())) {
        try {
            m->file->seek(startxrefs.back(), SEEK_SET);
            if (auto offset = QUtil::string_to_ll(readToken(*m->file).getValue().data())) {
                read_xref(offset);
                if (getRoot().getKey("/Pages").isDictionary()) {
                    QTC::TC("qpdf", "QPDF startxref more than 1024 before end");
                    warn(damagedPDF(
                        "", -1, "startxref was more than 1024 bytes before end of file"));
                    initializeEncryption();
                    m->parsed = true;
                    m->reconstructed_xref = false;
                    return;
                }
            }
        } catch (...) {
            // ok, bad luck. Do recovery.
        }
    }

    auto rend = found_objects.rend();
    for (auto it = found_objects.rbegin(); it != rend; it++) {
        auto [obj, gen, token_start] = *it;
        insertXrefEntry(obj, 1, token_start, gen);
        check_warnings();
    }
    m->deleted_objects.clear();

    for (auto it = trailers.rbegin(); it != trailers.rend(); it++) {
        m->file->seek(*it, SEEK_SET);
        auto t = readTrailer();
        if (!t.isDictionary()) {
            // Oh well.  It was worth a try.
        } else {
            if (t.hasKey("/Root")) {
                m->trailer = t;
                break;
            }
            warn(damagedPDF("trailer", *it, "recovered trailer has no /Root entry"));
        }
        check_warnings();
    }

    if (!m->trailer) {
        qpdf_offset_t max_offset{0};
        size_t max_size{0};
        // If there are any xref streams, take the last one to appear.
        for (auto const& iter: m->xref_table) {
            auto entry = iter.second;
            if (entry.getType() != 1) {
                continue;
            }
            auto oh = getObject(iter.first);
            try {
                if (!oh.isStreamOfType("/XRef")) {
                    continue;
                }
            } catch (std::exception&) {
                continue;
            }
            auto offset = entry.getOffset();
            auto size = oh.getDict().getKey("/Size").getUIntValueAsUInt();
            if (size > max_size || (size == max_size && offset > max_offset)) {
                max_offset = offset;
                setTrailer(oh.getDict());
            }
            check_warnings();
        }
        if (max_offset > 0) {
            try {
                read_xref(max_offset);
            } catch (std::exception&) {
                warn(damagedPDF(
                    "", -1, "error decoding candidate xref stream while recovering damaged file"));
            }
            QTC::TC("qpdf", "QPDF recover xref stream");
        }
    }

    if (!m->trailer || (!m->parsed && !m->trailer.getKey("/Root").isDictionary())) {
        // Try to find a Root dictionary. As a quick fix try the one with the highest object id.
        QPDFObjectHandle root;
        for (auto const& iter: m->obj_cache) {
            try {
                if (QPDFObjectHandle(iter.second.object).isDictionaryOfType("/Catalog")) {
                    root = iter.second.object;
                }
            } catch (std::exception&) {
                continue;
            }
        }
        if (root) {
            if (!m->trailer) {
                warn(damagedPDF(
                    "", -1, "unable to find trailer dictionary while recovering damaged file"));
                m->trailer = QPDFObjectHandle::newDictionary();
            }
            m->trailer.replaceKey("/Root", root);
        }
    }

    if (!m->trailer) {
        // We could check the last encountered object to see if it was an xref stream.  If so, we
        // could try to get the trailer from there.  This may make it possible to recover files with
        // bad startxref pointers even when they have object streams.

        throw damagedPDF("", -1, "unable to find trailer dictionary while recovering damaged file");
    }
    if (m->xref_table.empty()) {
        // We cannot check for an empty xref table in parse because empty tables are valid when
        // creating QPDF objects from JSON.
        throw damagedPDF("", -1, "unable to find objects while recovering damaged file");
    }
    check_warnings();
    if (!m->parsed) {
        m->parsed = true;
        getAllPages();
        check_warnings();
        if (m->all_pages.empty()) {
            m->parsed = false;
            throw damagedPDF("", -1, "unable to find any pages while recovering damaged file");
        }
    }
    // We could iterate through the objects looking for streams and try to find objects inside of
    // them, but it's probably not worth the trouble.  Acrobat can't recover files with any errors
    // in an xref stream, and this would be a real long shot anyway.  If we wanted to do anything
    // that involved looking at stream contents, we'd also have to call initializeEncryption() here.
    // It's safe to call it more than once.
}